

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O3

Error __thiscall asmjit::BaseRAPass::addExitBlock(BaseRAPass *this,RABlock *block)

{
  size_type *psVar1;
  uint uVar2;
  Error EVar3;
  
  *(byte *)&block->_flags = (byte)block->_flags | 0x10;
  uVar2 = (this->_exits).super_ZoneVectorBase._size;
  if (uVar2 == (this->_exits).super_ZoneVectorBase._capacity) {
    EVar3 = ZoneVectorBase::_grow(&(this->_exits).super_ZoneVectorBase,&this->_allocator,8,1);
    if (EVar3 != 0) {
      return EVar3;
    }
    uVar2 = (this->_exits).super_ZoneVectorBase._size;
  }
  *(RABlock **)((long)(this->_exits).super_ZoneVectorBase._data + (ulong)uVar2 * 8) = block;
  psVar1 = &(this->_exits).super_ZoneVectorBase._size;
  *psVar1 = *psVar1 + 1;
  return 0;
}

Assistant:

inline Error addExitBlock(RABlock* block) noexcept {
    block->addFlags(RABlock::kFlagIsFuncExit);
    return _exits.append(allocator(), block);
  }